

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<char> * __thiscall
cimg_library::CImgList<char>::insert(CImgList<char> *this,uint n,uint pos)

{
  uint local_6c;
  uint local_4c;
  uint i;
  uint npos;
  CImg<char> empty;
  uint pos_local;
  uint n_local;
  CImgList<char> *this_local;
  
  empty._data._0_4_ = pos;
  empty._data._4_4_ = n;
  CImg<char>::CImg((CImg<char> *)&npos);
  if (empty._data._4_4_ != 0) {
    if ((uint)empty._data == 0xffffffff) {
      local_6c = this->_width;
    }
    else {
      local_6c = (uint)empty._data;
    }
    for (local_4c = 0; local_4c < empty._data._4_4_; local_4c = local_4c + 1) {
      insert(this,(CImg<char> *)&npos,local_6c + local_4c,false);
    }
  }
  CImg<char>::~CImg((CImg<char> *)&npos);
  return this;
}

Assistant:

CImgList<T>& insert(const unsigned int n, const unsigned int pos=~0U) {
      CImg<T> empty;
      if (!n) return *this;
      const unsigned int npos = pos==~0U?_width:pos;
      for (unsigned int i = 0; i<n; ++i) insert(empty,npos+i);
      return *this;
    }